

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_1a7b72::VersionPrinter::print(VersionPrinter *this)

{
  char *pcVar1;
  int iVar2;
  raw_ostream *this_00;
  raw_ostream *prVar3;
  char *pcVar4;
  char *in_RCX;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  StringRef Str_06;
  StringRef Str_07;
  StringRef SVar5;
  string CPU;
  char *local_58;
  char *local_50;
  char local_48;
  undefined7 uStack_47;
  long *local_38;
  void *local_30;
  long local_28 [2];
  
  this_00 = llvm::outs();
  SVar5.Length = 0x1b;
  SVar5.Data = "LLVM (http://llvm.org/):\n  ";
  llvm::raw_ostream::operator<<(this_00,SVar5);
  Str.Length = 4;
  Str.Data = "LLVM";
  prVar3 = llvm::raw_ostream::operator<<(this_00,Str);
  Str_00.Length = 9;
  Str_00.Data = " version ";
  prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_00);
  Str_01.Length = 8;
  Str_01.Data = "7.0.0svn";
  llvm::raw_ostream::operator<<(prVar3,Str_01);
  Str_02.Length = 3;
  Str_02.Data = "\n  ";
  llvm::raw_ostream::operator<<(this_00,Str_02);
  Str_03.Length = 0xf;
  Str_03.Data = "Optimized build";
  llvm::raw_ostream::operator<<(this_00,Str_03);
  Str_04.Length = 0x10;
  Str_04.Data = " with assertions";
  llvm::raw_ostream::operator<<(this_00,Str_04);
  SVar5 = llvm::sys::getHostCPUName();
  pcVar4 = SVar5.Data;
  if (pcVar4 == (char *)0x0) {
    local_58 = &local_48;
    local_50 = (char *)0x0;
    local_48 = '\0';
  }
  else {
    in_RCX = &local_48;
    local_58 = in_RCX;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,pcVar4,pcVar4 + SVar5.Length);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  if (iVar2 == 0) {
    in_RCX = "(unknown)";
    std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x19ae78);
  }
  Str_05.Length = 2;
  Str_05.Data = ".\n";
  prVar3 = llvm::raw_ostream::operator<<(this_00,Str_05);
  Str_06.Length = 0x12;
  Str_06.Data = "  Default target: ";
  prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_06);
  llvm::sys::getDefaultTargetTriple_abi_cxx11_();
  prVar3 = (raw_ostream *)llvm::raw_ostream::write(prVar3,(int)local_38,local_30,(size_t)in_RCX);
  pcVar4 = prVar3->OutBufCur;
  if (pcVar4 < prVar3->OutBufEnd) {
    prVar3->OutBufCur = pcVar4 + 1;
    *pcVar4 = '\n';
  }
  else {
    prVar3 = (raw_ostream *)llvm::raw_ostream::write(prVar3,10,__buf,(size_t)pcVar4);
  }
  Str_07.Length = 0xc;
  Str_07.Data = "  Host CPU: ";
  prVar3 = llvm::raw_ostream::operator<<(prVar3,Str_07);
  llvm::raw_ostream::write(prVar3,(int)local_58,local_50,(size_t)pcVar4);
  __buf_00 = extraout_RDX;
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
    __buf_00 = extraout_RDX_00;
  }
  pcVar1 = this_00->OutBufCur;
  if (pcVar1 < this_00->OutBufEnd) {
    this_00->OutBufCur = pcVar1 + 1;
    *pcVar1 = '\n';
  }
  else {
    llvm::raw_ostream::write(this_00,10,__buf_00,(size_t)pcVar4);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return;
}

Assistant:

void print() {
    raw_ostream &OS = outs();
#ifdef PACKAGE_VENDOR
    OS << PACKAGE_VENDOR << " ";
#else
    OS << "LLVM (http://llvm.org/):\n  ";
#endif
    OS << PACKAGE_NAME << " version " << PACKAGE_VERSION;
#ifdef LLVM_VERSION_INFO
    OS << " " << LLVM_VERSION_INFO;
#endif
    OS << "\n  ";
#ifndef __OPTIMIZE__
    OS << "DEBUG build";
#else
    OS << "Optimized build";
#endif
#ifndef NDEBUG
    OS << " with assertions";
#endif
#if LLVM_VERSION_PRINTER_SHOW_HOST_TARGET_INFO
    std::string CPU = sys::getHostCPUName();
    if (CPU == "generic")
      CPU = "(unknown)";
    OS << ".\n"
       << "  Default target: " << sys::getDefaultTargetTriple() << '\n'
       << "  Host CPU: " << CPU;
#endif
    OS << '\n';
  }